

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O2

int format_hyp(char *outptr,int len,ps_endpointer_t *ep,ps_decoder_t *decoder)

{
  int32 logb_p;
  int iVar1;
  logmath_t *lmath;
  ps_config_t *config;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  float64 fVar5;
  double local_40;
  double local_38;
  
  lmath = ps_get_logmath(decoder);
  logb_p = ps_get_prob(decoder);
  fVar5 = logmath_exp(lmath,logb_p);
  if (ep == (ps_endpointer_t *)0x0) {
    iVar1 = ps_get_n_frames(decoder);
    config = ps_get_config(decoder);
    lVar2 = ps_config_int(config,"frate");
    local_40 = (double)iVar1 / (double)lVar2;
    local_38 = 0.0;
  }
  else {
    local_38 = ps_endpointer_speech_start(ep);
    local_40 = ps_endpointer_speech_end(ep);
  }
  pcVar3 = ps_get_hyp(decoder,(int32 *)0x0);
  pcVar4 = "";
  if (pcVar3 != (char *)0x0) {
    pcVar4 = pcVar3;
  }
  iVar1 = snprintf(outptr,(long)len,"{\"b\":%.3f,\"d\":%.3f,\"p\":%.3f,\"t\":\"%s\"",local_38,
                   local_40 - local_38,fVar5,pcVar4);
  return iVar1;
}

Assistant:

static int
format_hyp(char *outptr, int len, ps_endpointer_t *ep, ps_decoder_t *decoder)
{
    logmath_t *lmath;
    double prob, st, et;
    const char *hyp;

    lmath = ps_get_logmath(decoder);
    prob = logmath_exp(lmath, ps_get_prob(decoder));
    if (ep == NULL) {
        st = 0.0;
        et = (double)ps_get_n_frames(decoder)
            / ps_config_int(ps_get_config(decoder), "frate");
    }
    else {
        st = ps_endpointer_speech_start(ep);
        et = ps_endpointer_speech_end(ep);
    }
    hyp = ps_get_hyp(decoder, NULL);
    if (hyp == NULL)
        hyp = "";
    return snprintf(outptr, len, HYP_FORMAT, st, et - st, prob, hyp);
}